

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O3

int X509_sign(X509 *x,EVP_PKEY *pkey,EVP_MD *md)

{
  int iVar1;
  
  asn1_encoding_clear((ASN1_ENCODING *)&x->cert_info->enc);
  iVar1 = ASN1_item_sign((ASN1_ITEM *)&X509_CINF_it,x->cert_info->signature,x->sig_alg,x->signature,
                         x->cert_info,pkey,md);
  return iVar1;
}

Assistant:

int X509_sign(X509 *x, EVP_PKEY *pkey, const EVP_MD *md) {
  asn1_encoding_clear(&x->cert_info->enc);
  return (ASN1_item_sign(ASN1_ITEM_rptr(X509_CINF), x->cert_info->signature,
                         x->sig_alg, x->signature, x->cert_info, pkey, md));
}